

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGenCof.c
# Opt level: O0

int MarkCacheHash(char *ptr,int modulus)

{
  int local_24;
  MarkCacheKey *entry;
  int val;
  int modulus_local;
  char *ptr_local;
  
  local_24 = (int)*(undefined8 *)ptr * 0x3e5 + (int)*(undefined8 *)(ptr + 8);
  if (local_24 < 0) {
    local_24 = -local_24;
  }
  return local_24 % modulus;
}

Assistant:

static int
MarkCacheHash(
  const char * ptr,
  int  modulus)
{
    int val = 0;
    MarkCacheKey *entry;

    entry = (MarkCacheKey *) ptr;

    val = (int) (ptrint) entry->f;
    val = val * 997 + (int) (ptrint) entry->c;

    return ((val < 0) ? -val : val) % modulus;

}